

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void Curl_multi_closed(connectdata *conn,curl_socket_t s)

{
  Curl_easy *pCVar1;
  Curl_multi *pCVar2;
  void *pvVar3;
  curl_socket_t local_28;
  curl_socket_t local_24;
  
  pCVar1 = conn->data;
  if (pCVar1 != (Curl_easy *)0x0) {
    pCVar2 = pCVar1->multi;
    if (pCVar2 != (Curl_multi *)0x0) {
      _local_28 = CONCAT44((curl_socket_t)((ulong)pCVar1 >> 0x20),s);
      if (s != -1) {
        pvVar3 = Curl_hash_pick(&pCVar2->sockhash,&local_28,4);
        if (pvVar3 != (void *)0x0) {
          if (pCVar2->socket_cb != (curl_socket_callback)0x0) {
            (*pCVar2->socket_cb)
                      (conn->data,s,4,pCVar2->socket_userp,*(void **)((long)pvVar3 + 0x10));
          }
          _local_28 = CONCAT44(s,local_28);
          Curl_hash_delete(&pCVar2->sockhash,&local_24,4);
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_multi_closed(struct connectdata *conn, curl_socket_t s)
{
  if(conn->data) {
    /* if there's still an easy handle associated with this connection */
    struct Curl_multi *multi = conn->data->multi;
    if(multi) {
      /* this is set if this connection is part of a handle that is added to
         a multi handle, and only then this is necessary */
      struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

      if(entry) {
        if(multi->socket_cb)
          multi->socket_cb(conn->data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);

        /* now remove it from the socket hash */
        sh_delentry(&multi->sockhash, s);
      }
    }
  }
}